

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  PcodeOp *pPVar3;
  bool bVar4;
  int iVar5;
  OpCode OVar6;
  pointer ppVVar7;
  int iVar8;
  OpCode OVar9;
  pointer ppVVar10;
  bool bVar11;
  
  if (vn1 == vn2) {
    bVar4 = true;
  }
  else {
    do {
      if (((vn1->flags & 0x10) == 0) || ((vn2->flags & 0x10) == 0)) {
        if (((vn1->flags & 2) != 0) && ((vn2->flags & 2) != 0)) {
          return (vn1->loc).offset == (vn2->loc).offset;
        }
        bVar4 = isPossibleAliasStep(vn1,vn2);
        return bVar4;
      }
      bVar4 = isPossibleAliasStep(vn1,vn2);
      if (!bVar4) {
        return bVar4;
      }
      pPVar2 = vn1->def;
      OVar1 = pPVar2->opcode->opcode;
      iVar5 = 1;
      iVar8 = 1;
      OVar9 = CPUI_INT_ADD;
      if ((OVar1 != CPUI_PTRSUB) && (OVar9 = OVar1, OVar1 == CPUI_PTRADD)) {
        iVar8 = (int)((pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
        OVar9 = CPUI_INT_ADD;
      }
      pPVar3 = vn2->def;
      OVar1 = pPVar3->opcode->opcode;
      OVar6 = CPUI_INT_ADD;
      if ((OVar1 != CPUI_PTRSUB) && (OVar6 = OVar1, OVar1 == CPUI_PTRADD)) {
        iVar5 = (int)((pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[2]->loc).offset;
        OVar6 = CPUI_INT_ADD;
      }
      bVar11 = depth == 0;
      depth = depth + -1;
      if (bVar11) {
        return bVar4;
      }
      if (OVar9 != OVar6) {
        return bVar4;
      }
      if (CPUI_INT_NEGATE < OVar9) {
        return bVar4;
      }
      if ((0x3060002U >> (OVar9 & CPUI_INT_SRIGHT) & 1) != 0) {
        ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        goto LAB_002e5263;
      }
      if (OVar9 != CPUI_INT_ADD) {
        return bVar4;
      }
      ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar10 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (((ppVVar7[1]->flags & 2) == 0) || ((ppVVar10[1]->flags & 2) == 0)) {
        if (iVar8 != iVar5) {
          return bVar4;
        }
        bVar11 = functionalEquality(*ppVVar7,*ppVVar10);
        ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start + 1;
        if (bVar11) {
LAB_002e52be:
          ppVVar10 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
        }
        else {
          bVar11 = functionalEquality(*ppVVar7,(pPVar3->inrefs).
                                               super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1]);
          ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (!bVar11) {
            bVar11 = functionalEquality(*ppVVar7,(pPVar3->inrefs).
                                                 super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1]);
            ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            if (!bVar11) {
              bVar11 = functionalEquality(*ppVVar7,*(pPVar3->inrefs).
                                                                                                        
                                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
              if (!bVar11) {
                return bVar4;
              }
              ppVVar7 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              goto LAB_002e52be;
            }
          }
LAB_002e5263:
          ppVVar10 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else if ((long)iVar8 * (ppVVar7[1]->loc).offset - (long)iVar5 * (ppVVar10[1]->loc).offset != 0
              ) {
        bVar4 = functionalEquality(*ppVVar7,*ppVVar10);
        return !bVar4;
      }
      vn2 = *ppVVar10;
      vn1 = *ppVVar7;
    } while (vn1 != vn2);
  }
  return bVar4;
}

Assistant:

bool ActionMarkImplied::isPossibleAlias(Varnode *vn1,Varnode *vn2,int4 depth)

{
  if (vn1 == vn2) return true;	// Definite alias
  if ((!vn1->isWritten())||(!vn2->isWritten())) {
    if (vn1->isConstant() && vn2->isConstant())
      return (vn1->getOffset()==vn2->getOffset()); // FIXME: these could be NEAR each other and still have an alias
    return isPossibleAliasStep(vn1,vn2);
  }

  if (!isPossibleAliasStep(vn1,vn2))
    return false;
  Varnode *cvn1,*cvn2;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc1 = op1->code();
  OpCode opc2 = op2->code();
  int4 mult1 = 1;
  int4 mult2 = 1;
  if (opc1 == CPUI_PTRSUB)
    opc1 = CPUI_INT_ADD;
  else if (opc1 == CPUI_PTRADD) {
    opc1 = CPUI_INT_ADD;
    mult1 = (int4) op1->getIn(2)->getOffset();
  }
  if (opc2 == CPUI_PTRSUB)
    opc2 = CPUI_INT_ADD;
  else if (opc2 == CPUI_PTRADD) {
    opc2 = CPUI_INT_ADD;
    mult2 = (int4) op2->getIn(2)->getOffset();
  }
  if (opc1 != opc2) return true;
  if (depth == 0) return true;	// Couldn't find absolute difference
  depth -= 1;
  switch(opc1) {
  case CPUI_COPY:
  case CPUI_INT_ZEXT:
  case CPUI_INT_SEXT:
  case CPUI_INT_2COMP:
  case CPUI_INT_NEGATE:
    return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
  case CPUI_INT_ADD:
    cvn1 = op1->getIn(1);
    cvn2 = op2->getIn(1);
    if (cvn1->isConstant() && cvn2->isConstant()) {
      uintb val1 = mult1 * cvn1->getOffset();
      uintb val2 = mult2 * cvn2->getOffset();
      if (val1 == val2)
	return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
      return !functionalEquality(op1->getIn(0),op2->getIn(0));
    }
    if (mult1 != mult2) return true;
    if (functionalEquality(op1->getIn(0),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(1),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(0),op2->getIn(1)))
      return isPossibleAlias(op1->getIn(1),op2->getIn(0),depth);
    if (functionalEquality(op1->getIn(1),op2->getIn(0)))
      return isPossibleAlias(op1->getIn(0),op2->getIn(1),depth);
    break;
  default:
    break;
  }
  return true;
}